

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::api::anon_unknown_1::ImageView::create
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar1;
  VkImageViewCreateInfo local_50;
  
  local_50.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.flags = 0;
  local_50.viewType = params->viewType;
  local_50.format = params->format;
  local_50.components.r = (params->components).r;
  local_50.components.g = (params->components).g;
  local_50.components.b = (params->components).b;
  local_50.components.a = (params->components).a;
  local_50.subresourceRange.aspectMask = (params->subresourceRange).aspectMask;
  local_50.subresourceRange.baseMipLevel = (params->subresourceRange).baseMipLevel;
  local_50.subresourceRange.levelCount = (params->subresourceRange).levelCount;
  local_50.subresourceRange.baseArrayLayer = (params->subresourceRange).baseArrayLayer;
  local_50.subresourceRange.layerCount = (params->subresourceRange).layerCount;
  local_50.image.m_internal = (deUint64)res;
  pMVar1 = ::vk::createImageView
                     (__return_storage_ptr__,env->vkd,env->device,&local_50,env->allocationCallbacks
                     );
  return pMVar1;
}

Assistant:

static Move<VkImageView> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkImageViewCreateInfo	imageViewInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
			DE_NULL,
			(VkImageViewCreateFlags)0,
			*res.image.object,
			params.viewType,
			params.format,
			params.components,
			params.subresourceRange,
		};

		return createImageView(env.vkd, env.device, &imageViewInfo, env.allocationCallbacks);
	}